

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbox.cpp
# Opt level: O3

void __thiscall ftxui::HBox::SetBox(HBox *this,Box box)

{
  int iVar1;
  pointer puVar2;
  Node *pNVar3;
  int iVar4;
  unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *child;
  ulong uVar5;
  pointer puVar6;
  int iVar7;
  ulong uVar8;
  unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *child_1;
  pointer puVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  uVar8 = box._0_8_;
  Node::SetBox(&this->super_Node,box);
  puVar9 = (this->super_Node).children.
           super__Vector_base<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->super_Node).children.
           super__Vector_base<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar2) {
    uVar5 = uVar8 >> 0x20;
    iVar12 = 0;
    puVar6 = puVar9;
    do {
      iVar12 = iVar12 + (((puVar6->_M_t).
                          super___uniq_ptr_impl<ftxui::Node,_std::default_delete<ftxui::Node>_>._M_t
                          .super__Tuple_impl<0UL,_ftxui::Node_*,_std::default_delete<ftxui::Node>_>.
                          super__Head_base<0UL,_ftxui::Node_*,_false>._M_head_impl)->requirement_).
                        flex.x;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
    if (puVar9 != puVar2) {
      iVar7 = (box.x_max - ((this->super_Node).requirement_.min.x + box.x_min)) + 1;
      do {
        pNVar3 = (puVar9->_M_t).
                 super___uniq_ptr_impl<ftxui::Node,_std::default_delete<ftxui::Node>_>._M_t.
                 super__Tuple_impl<0UL,_ftxui::Node_*,_std::default_delete<ftxui::Node>_>.
                 super__Head_base<0UL,_ftxui::Node_*,_false>._M_head_impl;
        iVar1 = (pNVar3->requirement_).flex.x;
        uVar10 = ((pNVar3->requirement_).min.x + (int)uVar8) - 1;
        if ((iVar1 != 0) && (0 < iVar7)) {
          iVar4 = (iVar1 * iVar7) / iVar12;
          iVar7 = iVar7 - iVar4;
          iVar12 = iVar12 - iVar1;
          uVar10 = uVar10 + iVar4;
        }
        uVar11 = (ulong)uVar10;
        if (box.x_max <= (int)uVar10) {
          uVar11 = uVar5;
        }
        (*pNVar3->_vptr_Node[3])(pNVar3,uVar8 & 0xffffffff | uVar11 << 0x20,box._8_8_);
        puVar9 = puVar9 + 1;
        uVar8 = (ulong)((int)uVar11 + 1);
      } while (puVar9 != puVar2);
    }
  }
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    int flex_sum = 0;
    for (auto& child : children)
      flex_sum += child->requirement().flex.x;

    int space = box.x_max - box.x_min + 1;
    int extra_space = space - requirement_.min.x;

    int remaining_flex = flex_sum;
    int remaining_extra_space = extra_space;

    int x = box.x_min;
    for (auto& child : children) {
      Box child_box = box;
      child_box.x_min = x;

      child_box.x_max = x + child->requirement().min.x - 1;

      if (child->requirement().flex.x && remaining_extra_space > 0) {
        int added_space = remaining_extra_space * child->requirement().flex.x /
                          remaining_flex;
        remaining_extra_space -= added_space;
        remaining_flex -= child->requirement().flex.x;
        child_box.x_max += added_space;
      }
      child_box.x_max = std::min(child_box.x_max, box.x_max);

      child->SetBox(child_box);
      x = child_box.x_max + 1;
    }
  }